

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnSimdLaneOpExpr
          (ExprVisitorDelegate *this,SimdLaneOpExpr *expr)

{
  WatWriter *this_00;
  Info local_50;
  
  this_00 = this->writer_;
  Opcode::GetInfo(&local_50,&expr->opcode);
  WritePuts(this_00,local_50.name,Space);
  Writef(this->writer_,"%lu",expr->val);
  WritePuts(this->writer_,"",Newline);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnSimdLaneOpExpr(SimdLaneOpExpr* expr) {
  writer_->WritePutsSpace(expr->opcode.GetName());
  writer_->Writef("%" PRIu64, (expr->val));
  writer_->WritePutsNewline("");
  return Result::Ok;
}